

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
::find_position<HashObject<4,4>>
          (dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
           *this,HashObject<4,_4> *key)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  
  g_num_hashes = g_num_hashes + 1;
  uVar2 = *(long *)(this + 0x38) - 1U & (long)key->i_;
  iVar4 = *(int *)(*(long *)(this + 0x48) + uVar2 * 8);
  uVar1 = 0xffffffffffffffff;
  if (*(int *)(this + 0x24) == iVar4) {
    uVar5 = 0xffffffffffffffff;
  }
  else {
    uVar5 = 0xffffffffffffffff;
    lVar3 = 1;
    do {
      if ((*(long *)(this + 0x28) == 0) || (*(int *)(this + 0x20) != iVar4)) {
        if (key->i_ == iVar4) {
          uVar1 = uVar2;
          uVar2 = 0xffffffffffffffff;
          goto LAB_0012ae30;
        }
      }
      else if (uVar5 == 0xffffffffffffffff) {
        uVar5 = uVar2;
      }
      uVar2 = uVar2 + lVar3 & *(long *)(this + 0x38) - 1U;
      iVar4 = *(int *)(*(long *)(this + 0x48) + uVar2 * 8);
      lVar3 = lVar3 + 1;
    } while (*(int *)(this + 0x24) != iVar4);
  }
  if (uVar5 != 0xffffffffffffffff) {
    uVar2 = uVar5;
  }
LAB_0012ae30:
  pVar6.second = uVar2;
  pVar6.first = uVar1;
  return pVar6;
}

Assistant:

size_type bucket_count() const { return num_buckets; }